

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-ransom-note.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *this;
  ostream *this_00;
  char *pcVar2;
  int local_1fc;
  bool local_1f5;
  int i_1;
  bool doable;
  int local_1e4;
  string local_1e0 [4];
  int i;
  string word;
  undefined1 local_1c0 [8];
  Trie trie;
  int local_10;
  int n;
  int m;
  
  n = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>(this,(int *)((long)trie.child + 0x19c));
  Trie::Trie((Trie *)local_1c0);
  std::__cxx11::string::string(local_1e0);
  for (local_1e4 = 0; local_1e4 < local_10; local_1e4 = local_1e4 + 1) {
    std::operator>>((istream *)&std::cin,local_1e0);
    Trie::add((Trie *)local_1c0,(string *)local_1e0);
  }
  local_1f5 = true;
  for (local_1fc = 0; local_1fc < trie.child[0x33]._4_4_; local_1fc = local_1fc + 1) {
    std::operator>>((istream *)&std::cin,local_1e0);
    bVar1 = Trie::use((Trie *)local_1c0,(string *)local_1e0);
    local_1f5 = (local_1f5 & bVar1) != 0;
  }
  pcVar2 = "No";
  if (local_1f5 != false) {
    pcVar2 = "Yes";
  }
  this_00 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e0);
  Trie::~Trie((Trie *)local_1c0);
  return n;
}

Assistant:

int main() {
  int m, n;
  std::cin >> m >> n;
  Trie trie;
  std::string word;
  for (int i = 0; i < m; ++i) {
    std::cin >> word;
    trie.add(word);
  }
  bool doable = true;
  for (int i = 0; i < n; ++i) {
    std::cin >> word;
    doable &= trie.use(word);
  }
  std::cout << (doable ? "Yes" : "No") << std::endl;
}